

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_IXOR_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint32_t val;
  int in_EDX;
  long in_RSI;
  JitCompilerX86 *in_RDI;
  uint8_t (*in_stack_ffffffffffffffd8) [2];
  
  in_RDI->registerUsage[*(byte *)(in_RSI + 1)] = in_EDX;
  if (*(char *)(in_RSI + 2) == *(char *)(in_RSI + 1)) {
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
    emitByte(in_RDI,*(char *)(in_RSI + 1) + 0xf0);
    val = Instruction::getImm32((Instruction *)0x13e505);
    emit32(in_RDI,val);
  }
  else {
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
    emitByte(in_RDI,*(char *)(in_RSI + 1) * '\b' + -0x40 + *(char *)(in_RSI + 2));
  }
  return;
}

Assistant:

void JitCompilerX86::h_IXOR_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			emit(REX_XOR_RR);
			emitByte(0xc0 + 8 * instr.dst + instr.src);
		}
		else {
			emit(REX_XOR_RI);
			emitByte(0xf0 + instr.dst);
			emit32(instr.getImm32());
		}
	}